

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O2

void __thiscall
helics::CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker>::~CommsBroker
          (CommsBroker<helics::ipc::IpcComms,_helics::CoreBroker> *this)

{
  int iVar1;
  rep in_RAX;
  int iVar2;
  bool bVar3;
  duration<long,_std::ratio<1L,_1000L>_> local_38;
  
  (this->super_CoreBroker).super_Broker._vptr_Broker = (_func_int **)&PTR__CommsBroker_004611b8;
  (this->super_CoreBroker).super_BrokerBase._vptr_BrokerBase =
       (_func_int **)&PTR__CommsBroker_00461310;
  LOCK();
  (this->super_CoreBroker).super_BrokerBase.haltOperations._M_base._M_i = true;
  UNLOCK();
  local_38.__r = in_RAX;
  iVar2 = 2;
  while( true ) {
    LOCK();
    iVar1 = (this->disconnectionStage).super___atomic_base<int>._M_i;
    bVar3 = iVar2 == iVar1;
    if (bVar3) {
      (this->disconnectionStage).super___atomic_base<int>._M_i = 3;
      iVar1 = iVar2;
    }
    UNLOCK();
    if (bVar3) break;
    if (iVar1 == 0) {
      commDisconnect(this);
      iVar2 = 1;
    }
    else {
      local_38.__r = 0x32;
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_38);
      iVar2 = iVar1;
    }
  }
  std::__uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>::reset
            ((__uniq_ptr_impl<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_> *)
             &this->comms,(pointer)0x0);
  BrokerBase::joinAllThreads(&(this->super_CoreBroker).super_BrokerBase);
  std::unique_ptr<helics::ipc::IpcComms,_std::default_delete<helics::ipc::IpcComms>_>::~unique_ptr
            (&this->comms);
  CoreBroker::~CoreBroker(&this->super_CoreBroker);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::~CommsBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            commDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    comms = nullptr;  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}